

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>_*,_toml::error_info> *
toml::detail::insert_value<toml::type_config>
          (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *__return_storage_ptr__,
          inserting_value_kind kind,table_type *current_table_ptr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,region *key_reg,basic_value<toml::type_config> *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  failure<toml::error_info> *__return_storage_ptr___00;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pbVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  bool bVar10;
  basic_value<toml::type_config> *e;
  long lVar11;
  ulong uVar12;
  iterator iVar13;
  table_format_info *ptVar14;
  basic_value<toml::type_config> *pbVar15;
  char *pcVar16;
  array_format_info *paVar17;
  array_type *paVar18;
  table_type *ptVar19;
  value_type *pvVar20;
  vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
  *this;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  _Var21;
  undefined8 uVar22;
  pointer pbVar23;
  basic_value<toml::type_config> *unaff_RBP;
  key_type *pkVar24;
  __hashtable *__h;
  ulong unaff_R13;
  __node_base *p_Var25;
  key_type *__k;
  __hashtable *__h_1;
  basic_value<toml::type_config> *pbVar26;
  initializer_list<toml::basic_value<toml::type_config>_> __l;
  table_format_info fmt;
  undefined1 local_fb8 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f98;
  undefined8 local_f80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f70 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_f08;
  undefined1 local_ef0 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ed0;
  undefined8 local_eb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea8 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e40;
  long local_e28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e20;
  string local_e18;
  undefined1 local_df8 [32];
  undefined1 local_dd8 [32];
  basic_value<toml::type_config> *local_db8 [2];
  pointer local_da8 [2];
  undefined1 local_d98 [32];
  string local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [32];
  string local_d38 [16];
  undefined1 local_d28 [16];
  undefined1 local_d18 [32];
  string local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [32];
  string local_cb8 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [32];
  string local_c78 [16];
  undefined1 local_c68 [16];
  undefined1 local_c58 [32];
  string local_c38 [16];
  undefined1 local_c28 [16];
  undefined1 local_c18 [32];
  string local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [32];
  string local_bb8 [16];
  undefined1 local_ba8 [16];
  undefined1 local_b98 [32];
  string local_b78 [16];
  undefined1 local_b68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b38;
  source_location key_loc;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  local_aa0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a88;
  error_info local_a50;
  source_location local_9f8;
  region_type local_978;
  source_location local_910;
  source_location local_898;
  source_location local_820;
  source_location local_7a8;
  source_location local_730;
  source_location local_6b8;
  source_location local_640;
  source_location local_5c8;
  source_location local_550;
  source_location local_4d8;
  undefined1 local_460 [192];
  failure<toml::error_info> local_3a0;
  failure<toml::error_info> local_348;
  failure<toml::error_info> local_2f0;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  source_location::source_location(&key_loc,key_reg);
  pbVar23 = (keys->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23;
  local_e20 = keys;
  if (lVar11 != 0) {
    uVar12 = lVar11 >> 5;
    local_e28 = (ulong)(kind != dotted_keys) * 2 + 0x202;
    pbVar26 = (basic_value<toml::type_config> *)0x0;
    do {
      __k = pbVar23 + (long)pbVar26;
      pbVar26 = (basic_value<toml::type_config> *)((long)pbVar26 + 1);
      if (uVar12 <= pbVar26) {
        if (kind != std_table) {
          if (kind == array_table) {
            iVar13 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&current_table_ptr->_M_h,__k);
            if (iVar13.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (*(char *)((long)iVar13.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                  ._M_cur + 0x28) != '\t') goto LAB_003be7b5;
              pcVar16 = (char *)**(undefined8 **)
                                  ((long)iVar13.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                         ._M_cur + 0x30);
              pcVar2 = (char *)(*(undefined8 **)
                                 ((long)iVar13.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                        ._M_cur + 0x30))[1];
              if (pcVar16 == pcVar2) goto LAB_003be7b5;
              pbVar26 = (basic_value<toml::type_config> *)
                        ((long)iVar13.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                               ._M_cur + 0x28);
              goto LAB_003be75a;
            }
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_fb8,val);
            __l._M_len = 1;
            __l._M_array = (basic_value<toml::type_config> *)local_fb8;
            std::
            vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            ::vector(&local_aa0,__l,(allocator_type *)&local_a50);
            local_b68._16_8_ = 0;
            local_b68._24_8_ = 0;
            local_b48._M_allocated_capacity = 0;
            local_978.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (key_reg->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_978.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (key_reg->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            (key_reg->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_978.source_name_._M_dataplus._M_p = (pointer)&local_978.source_name_.field_2;
            (key_reg->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(key_reg->source_name_)._M_dataplus._M_p;
            paVar1 = &(key_reg->source_name_).field_2;
            if (paVar3 == paVar1) {
              local_978.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_978.source_name_.field_2._8_8_ =
                   *(undefined8 *)((long)&(key_reg->source_name_).field_2 + 8);
            }
            else {
              local_978.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_978.source_name_._M_dataplus._M_p = (pointer)paVar3;
            }
            local_978.source_name_._M_string_length = (key_reg->source_name_)._M_string_length;
            (key_reg->source_name_)._M_dataplus._M_p = (pointer)paVar1;
            (key_reg->source_name_)._M_string_length = 0;
            (key_reg->source_name_).field_2._M_local_buf[0] = '\0';
            local_978.last_column_ = key_reg->last_column_;
            local_978.length_ = key_reg->length_;
            local_978.first_ = key_reg->first_;
            local_978.first_line_ = key_reg->first_line_;
            local_978.first_column_ = key_reg->first_column_;
            local_978.last_ = key_reg->last_;
            local_978.last_line_ = key_reg->last_line_;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_ef0,&local_aa0,
                       (array_format_info)ZEXT812(0x400000203),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_b68 + 0x10),&local_978);
            pkVar24 = __k;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)current_table_ptr,__k,(basic_value<toml::type_config> *)local_ef0);
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_ef0,(EVP_PKEY_CTX *)pkVar24);
            pbVar26 = (basic_value<toml::type_config> *)&DAT_000000b0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_e40);
            region::~region((region *)local_ea8);
            region::~region(&local_978);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_b68 + 0x10));
            std::
            vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            ::~vector(&local_aa0);
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_fb8,(EVP_PKEY_CTX *)pkVar24);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&vStack_f08);
            region::~region((region *)local_f70);
            iVar13 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&current_table_ptr->_M_h,__k);
            if (iVar13.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              paVar18 = basic_value<toml::type_config>::as_array
                                  ((basic_value<toml::type_config> *)
                                   ((long)iVar13.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                          ._M_cur + 0x28));
              goto LAB_003bf272;
            }
LAB_003bf67c:
            std::__throw_out_of_range("_Map_base::at");
            goto LAB_003bf688;
          }
          pbVar15 = (basic_value<toml::type_config> *)current_table_ptr;
          if (kind != dotted_keys) goto LAB_003be151;
          iVar13 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&current_table_ptr->_M_h,__k);
          if (iVar13.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)current_table_ptr,__k,val);
            _Var21._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&current_table_ptr->_M_h,__k);
            if (_Var21._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
              goto LAB_003beac9;
            }
            goto LAB_003beaed;
          }
          pbVar26 = (basic_value<toml::type_config> *)local_ca8;
          local_cb8._0_8_ = pbVar26;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_cb8,"toml::insert_value: failed to insert a value, value already exists",
                     "");
          source_location::source_location(&local_730,&key_loc);
          local_cd8._0_8_ = local_cd8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"inserting this","");
          iVar13 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&current_table_ptr->_M_h,__k);
          if (iVar13.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_003bf664;
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[25]>
                    ((error_info *)local_fb8,(toml *)local_cb8,(string *)&local_730,
                     (source_location *)local_cd8,(string *)local_ef0,
                     (source_location *)"but value already exists",&__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_240,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_240);
          failure<toml::error_info>::~failure(&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((undefined1 *)local_cd8._0_8_ != local_cd8 + 0x10) {
            operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
          }
          source_location::~source_location(&local_730);
          local_ce8._0_8_ = local_ca8._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_cb8._0_8_;
          if ((basic_value<toml::type_config> *)local_cb8._0_8_ != pbVar26) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        iVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&current_table_ptr->_M_h,__k);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_003beac9:
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)current_table_ptr,__k,val);
          _Var21._M_cur =
               (__node_type *)
               std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&current_table_ptr->_M_h,__k);
          if (_Var21._M_cur == (__node_type *)0x0) goto LAB_003bf670;
          goto LAB_003beaed;
        }
        if (*(char *)((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x28) == '\n') {
          pbVar26 = (basic_value<toml::type_config> *)
                    ((long)iVar13.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                           ._M_cur + 0x28);
          ptVar14 = basic_value<toml::type_config>::as_table_fmt(pbVar26);
          if (ptVar14->fmt == implicit) {
            ptVar19 = basic_value<toml::type_config>::as_table_abi_cxx11_(val);
            p_Var25 = &(ptVar19->_M_h)._M_before_begin;
            goto LAB_003be6ec;
          }
        }
        local_cf8._0_8_ = (basic_value<toml::type_config> *)local_ce8;
        std::__cxx11::string::_M_construct<char_const*>
                  (local_cf8,"toml::insert_value: failed to insert a table, table already defined",
                   "");
        source_location::source_location(&local_7a8,&key_loc);
        local_d18._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d18 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d18,"inserting this","");
        source_location::source_location
                  ((source_location *)local_ef0,
                   (region *)
                   ((long)iVar13.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x70));
        make_error_info<toml::source_location,char_const(&)[33]>
                  ((error_info *)local_fb8,(toml *)local_cf8,(string *)&local_7a8,
                   (source_location *)local_d18,(string *)local_ef0,
                   (source_location *)"this table is explicitly defined",
                   &__return_storage_ptr__->is_ok_);
        err<toml::error_info>(&local_298,(error_info *)local_fb8);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_298)
        ;
        failure<toml::error_info>::~failure(&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f80 != local_f70) {
          operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_f98);
        if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
          operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
        }
        source_location::~source_location((source_location *)local_ef0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d18._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d18 + 0x10)) {
          operator_delete((void *)local_d18._0_8_,local_d18._16_8_ + 1);
        }
        source_location::~source_location(&local_7a8);
        pbVar15 = (basic_value<toml::type_config> *)local_cf8._0_8_;
        if ((basic_value<toml::type_config> *)local_cf8._0_8_ !=
            (basic_value<toml::type_config> *)local_ce8) goto LAB_003be4df;
        goto LAB_003be4e7;
      }
      iVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&current_table_ptr->_M_h,__k);
      unaff_RBP = (basic_value<toml::type_config> *)current_table_ptr;
      if (iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_a88._M_buckets = &local_a88._M_single_bucket;
        local_a88._M_bucket_count = 1;
        local_a88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_a88._M_element_count = 0;
        local_a88._M_rehash_policy._M_max_load_factor = 1.0;
        local_a88._M_rehash_policy._4_4_ = 0;
        local_a88._M_rehash_policy._M_next_resize = 0;
        local_a88._M_single_bucket = (__node_base_ptr)0x0;
        local_b38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        region::region((region *)local_460,key_reg);
        unaff_R13 = (ulong)((uint)unaff_R13 & 0xffff0000) + local_e28;
        fmt.name_indent = 0;
        fmt.closing_indent = 0;
        fmt._0_8_ = unaff_R13;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_ef0,(table_type *)&local_a88,fmt,
                   &local_b38,(region_type *)local_460);
        pkVar24 = __k;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)current_table_ptr,__k,(basic_value<toml::type_config> *)local_ef0);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_ef0,(EVP_PKEY_CTX *)pkVar24);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e40);
        region::~region((region *)local_ea8);
        region::~region((region *)local_460);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b38);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_a88);
        iVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&current_table_ptr->_M_h,__k);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pbVar15 = (basic_value<toml::type_config> *)
                    basic_value<toml::type_config>::as_table_abi_cxx11_
                              ((basic_value<toml::type_config> *)
                               ((long)iVar13.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                      ._M_cur + 0x28));
          goto LAB_003be151;
        }
        std::__throw_out_of_range("_Map_base::at");
        current_table_ptr = (table_type *)local_460;
LAB_003bf664:
        std::__throw_out_of_range("_Map_base::at");
LAB_003bf670:
        std::__throw_out_of_range("_Map_base::at");
        goto LAB_003bf67c;
      }
      pbVar15 = (basic_value<toml::type_config> *)
                ((long)iVar13.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ._M_cur + 0x28);
      if (*(char *)((long)iVar13.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x28) == '\t') {
        pcVar16 = (char *)**(undefined8 **)
                            ((long)iVar13.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                   ._M_cur + 0x30);
        pcVar2 = (char *)(*(undefined8 **)
                           ((long)iVar13.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                  ._M_cur + 0x30))[1];
        if (pcVar16 == pcVar2) goto LAB_003be1f5;
        do {
          if (*pcVar16 != '\n') goto LAB_003be1f5;
          pcVar16 = pcVar16 + 200;
        } while (pcVar16 != pcVar2);
        paVar17 = basic_value<toml::type_config>::as_array_fmt(pbVar15);
        if (paVar17->fmt != array_of_tables) {
          local_bf8._0_8_ = (basic_value<toml::type_config> *)local_be8;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_bf8,"toml::insert_value:inline array of tables are immutable","");
          source_location::source_location(&local_5c8,&key_loc);
          local_c18._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c18 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"inserting this","");
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[23]>
                    ((error_info *)local_fb8,(toml *)local_bf8,(string *)&local_5c8,
                     (source_location *)local_c18,(string *)local_ef0,
                     (source_location *)"inline array of tables",&__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_138,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_138);
          failure<toml::error_info>::~failure(&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c18._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c18 + 0x10)) {
            operator_delete((void *)local_c18._0_8_,local_c18._16_8_ + 1);
          }
          source_location::~source_location(&local_5c8);
          local_ce8._0_8_ = local_be8._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_bf8._0_8_;
          if ((basic_value<toml::type_config> *)local_bf8._0_8_ !=
              (basic_value<toml::type_config> *)local_be8) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        if (kind == dotted_keys) {
          local_c38._0_8_ = (basic_value<toml::type_config> *)local_c28;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_c38,"toml::insert_value:dotted key cannot reopen an array-of-tables","");
          source_location::source_location(&local_640,&key_loc);
          local_c58._0_8_ = local_c58 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c58,"inserting this","");
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[25]>
                    ((error_info *)local_fb8,(toml *)local_c38,(string *)&local_640,
                     (source_location *)local_c58,(string *)local_ef0,
                     (source_location *)"to this array-of-tables.",&__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_190,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_190);
          failure<toml::error_info>::~failure(&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((undefined1 *)local_c58._0_8_ != local_c58 + 0x10) {
            operator_delete((void *)local_c58._0_8_,local_c58._16_8_ + 1);
          }
          source_location::~source_location(&local_640);
          local_ce8._0_8_ = local_c28._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_c38._0_8_;
          if ((basic_value<toml::type_config> *)local_c38._0_8_ !=
              (basic_value<toml::type_config> *)local_c28) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        paVar18 = basic_value<toml::type_config>::as_array(pbVar15);
        pbVar15 = (basic_value<toml::type_config> *)
                  basic_value<toml::type_config>::as_table_abi_cxx11_
                            ((paVar18->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      else {
        if (*(char *)((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x28) != '\n') {
LAB_003be1f5:
          local_c78._0_8_ = (basic_value<toml::type_config> *)local_c68;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_c78,"toml::insert_value: failed to insert a value, value already exists",
                     "");
          source_location::source_location(&local_6b8,&key_loc);
          local_c98._0_8_ = local_c98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c98,"while inserting this","");
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[31]>
                    ((error_info *)local_fb8,(toml *)local_c78,(string *)&local_6b8,
                     (source_location *)local_c98,(string *)local_ef0,
                     (source_location *)"non-table value already exists",
                     &__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_1e8,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_1e8);
          failure<toml::error_info>::~failure(&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((undefined1 *)local_c98._0_8_ != local_c98 + 0x10) {
            operator_delete((void *)local_c98._0_8_,local_c98._16_8_ + 1);
          }
          source_location::~source_location(&local_6b8);
          local_ce8._0_8_ = local_c68._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_c78._0_8_;
          if ((basic_value<toml::type_config> *)local_c78._0_8_ !=
              (basic_value<toml::type_config> *)local_c68) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        ptVar14 = basic_value<toml::type_config>::as_table_fmt(pbVar15);
        if ((ptVar14->fmt & ~dotted) == oneline) {
          local_b78._0_8_ = (basic_value<toml::type_config> *)local_b68;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_b78,
                     "toml::insert_value: failed to insert a value: inline table is immutable","");
          source_location::source_location(&local_4d8,&key_loc);
          local_b98._0_8_ = local_b98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"inserting this","");
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[14]>
                    ((error_info *)local_fb8,(toml *)local_b78,(string *)&local_4d8,
                     (source_location *)local_b98,(string *)local_ef0,
                     (source_location *)"to this table",&__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_88,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88
                    );
          failure<toml::error_info>::~failure(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((undefined1 *)local_b98._0_8_ != local_b98 + 0x10) {
            operator_delete((void *)local_b98._0_8_,local_b98._16_8_ + 1);
          }
          source_location::~source_location(&local_4d8);
          local_ce8._0_8_ = local_b68._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_b78._0_8_;
          if ((basic_value<toml::type_config> *)local_b78._0_8_ !=
              (basic_value<toml::type_config> *)local_b68) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        if ((kind == dotted_keys) && (ptVar14->fmt != dotted)) {
          local_bb8._0_8_ = (basic_value<toml::type_config> *)local_ba8;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_bb8,"toml::insert_value: reopening a table using dotted keys","");
          source_location::source_location(&local_550,&key_loc);
          local_bd8._0_8_ = local_bd8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_bd8,"dotted key cannot reopen a table","");
          source_location::source_location
                    ((source_location *)local_ef0,
                     (region *)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[29]>
                    ((error_info *)local_fb8,(toml *)local_bb8,(string *)&local_550,
                     (source_location *)local_bd8,(string *)local_ef0,
                     (source_location *)"this table is already closed",
                     &__return_storage_ptr__->is_ok_);
          err<toml::error_info>(&local_e0,(error_info *)local_fb8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0
                    );
          failure<toml::error_info>::~failure(&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f80 != local_f70) {
            operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_f98);
          if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
            operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_ef0);
          if ((undefined1 *)local_bd8._0_8_ != local_bd8 + 0x10) {
            operator_delete((void *)local_bd8._0_8_,local_bd8._16_8_ + 1);
          }
          source_location::~source_location(&local_550);
          local_ce8._0_8_ = local_ba8._0_8_;
          pbVar15 = (basic_value<toml::type_config> *)local_bb8._0_8_;
          if ((basic_value<toml::type_config> *)local_bb8._0_8_ !=
              (basic_value<toml::type_config> *)local_ba8) goto LAB_003be4df;
          goto LAB_003be4e7;
        }
        pbVar15 = (basic_value<toml::type_config> *)
                  basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar15);
      }
LAB_003be151:
      pbVar23 = (local_e20->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(local_e20->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >> 5;
      current_table_ptr = (table_type *)pbVar15;
    } while (pbVar26 < uVar12);
  }
  local_df8._0_8_ = (basic_value<toml::type_config> *)(local_df8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_df8,"toml::insert_key: no keys found","");
  paVar1 = &key_loc.file_name_.field_2;
  local_9f8.file_name_._M_dataplus._M_p = (pointer)&local_9f8.file_name_.field_2;
  local_9f8.last_offset_._0_4_ = (undefined4)key_loc.last_offset_;
  local_9f8.last_offset_._4_4_ = key_loc.last_offset_._4_4_;
  local_9f8.length_._0_4_ = (undefined4)key_loc.length_;
  local_9f8.length_._4_4_ = key_loc.length_._4_4_;
  local_9f8.last_line_._0_4_ = (undefined4)key_loc.last_line_;
  local_9f8.last_line_._4_4_ = key_loc.last_line_._4_4_;
  local_9f8.last_column_._0_4_ = (undefined4)key_loc.last_column_;
  local_9f8.last_column_._4_4_ = key_loc.last_column_._4_4_;
  local_9f8.first_column_._0_4_ = (undefined4)key_loc.first_column_;
  local_9f8.first_column_._4_4_ = key_loc.first_column_._4_4_;
  local_9f8.first_offset_._0_4_ = (undefined4)key_loc.first_offset_;
  local_9f8.first_offset_._4_4_ = key_loc.first_offset_._4_4_;
  local_9f8.is_ok_ = key_loc.is_ok_;
  local_9f8._1_7_ = key_loc._1_7_;
  local_9f8.first_line_ = key_loc.first_line_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)key_loc.file_name_._M_dataplus._M_p == paVar1) {
    local_9f8.file_name_.field_2._8_8_ = key_loc.file_name_.field_2._8_8_;
  }
  else {
    local_9f8.file_name_._M_dataplus._M_p = key_loc.file_name_._M_dataplus._M_p;
  }
  local_9f8.file_name_._M_string_length = key_loc.file_name_._M_string_length;
  key_loc.file_name_._M_string_length = 0;
  key_loc.file_name_.field_2._M_local_buf[0] = '\0';
  local_9f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       key_loc.line_str_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_9f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       key_loc.line_str_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_9f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       key_loc.line_str_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  key_loc.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key_loc.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key_loc.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
  key_loc.file_name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e18,"here","");
  make_error_info<>((error_info *)local_ef0,(string *)local_df8,&local_9f8,&local_e18);
  __return_storage_ptr___00 = (failure<toml::error_info> *)(local_460 + 0x68);
  err<toml::error_info>(__return_storage_ptr___00,(error_info *)local_ef0);
  __return_storage_ptr__->is_ok_ = false;
  failure<toml::error_info>::failure
            ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
             __return_storage_ptr___00);
  failure<toml::error_info>::~failure(__return_storage_ptr___00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb8 != local_ea8) {
    operator_delete((void *)local_eb8,(ulong)(local_ea8[0]._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_ed0);
  if ((undefined1 *)local_ef0._0_8_ != local_ef0 + 0x10) {
    operator_delete((void *)local_ef0._0_8_,local_ef0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
    operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location(&local_9f8);
  local_ce8._0_8_ = local_df8._16_8_;
  pbVar15 = (basic_value<toml::type_config> *)local_df8._0_8_;
  if ((basic_value<toml::type_config> *)local_df8._0_8_ ==
      (basic_value<toml::type_config> *)(local_df8 + 0x10)) goto LAB_003be4e7;
  goto LAB_003be4df;
LAB_003be7b5:
  local_d78._0_8_ = (basic_value<toml::type_config> *)local_d68;
  std::__cxx11::string::_M_construct<char_const*>
            (local_d78,
             "toml::insert_value: failed to insert an array of tables, value already exists","");
  source_location::source_location(&local_898,&key_loc);
  local_d98._0_8_ = local_d98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d98,"while inserting this","");
  source_location::source_location
            ((source_location *)local_ef0,
             (region *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                    ._M_cur + 0x70));
  make_error_info<toml::source_location,char_const(&)[31]>
            ((error_info *)local_fb8,(toml *)local_d78,(string *)&local_898,
             (source_location *)local_d98,(string *)local_ef0,
             (source_location *)"non-table value already exists",&__return_storage_ptr__->is_ok_);
  err<toml::error_info>(&local_348,(error_info *)local_fb8);
  __return_storage_ptr__->is_ok_ = false;
  failure<toml::error_info>::failure
            ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_348);
  failure<toml::error_info>::~failure(&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f80 != local_f70) {
    operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_f98);
  if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
    operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
  }
  source_location::~source_location((source_location *)local_ef0);
  if ((undefined1 *)local_d98._0_8_ != local_d98 + 0x10) {
    operator_delete((void *)local_d98._0_8_,local_d98._16_8_ + 1);
  }
  source_location::~source_location(&local_898);
  local_ce8._0_8_ = local_d68._0_8_;
  pbVar15 = (basic_value<toml::type_config> *)local_d78._0_8_;
  if ((basic_value<toml::type_config> *)local_d78._0_8_ ==
      (basic_value<toml::type_config> *)local_d68) goto LAB_003be4e7;
  goto LAB_003be4df;
LAB_003be6ec:
  p_Var25 = p_Var25->_M_nxt;
  if (p_Var25 == (__node_base *)0x0) goto LAB_003bf28d;
  unaff_RBP = (basic_value<toml::type_config> *)(p_Var25 + 1);
  bVar10 = basic_value<toml::type_config>::contains(pbVar26,(key_type *)unaff_RBP);
  if (bVar10) goto LAB_003bf322;
  pvVar20 = basic_value<toml::type_config>::operator[](pbVar26,(key_type *)unaff_RBP);
  basic_value<toml::type_config>::operator=(pvVar20,(basic_value<toml::type_config> *)(p_Var25 + 5))
  ;
  goto LAB_003be6ec;
LAB_003bf28d:
  ptVar14 = basic_value<toml::type_config>::as_table_fmt(pbVar26);
  ptVar14->fmt = multiline;
  *(element_type **)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0x70) =
       (val->region_).source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                    ._M_cur + 0x78),
             &(val->region_).source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                    ._M_cur + 0x80),&(val->region_).source_name_);
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xd0) = (val->region_).last_column_;
  sVar5 = (val->region_).length_;
  sVar6 = (val->region_).first_;
  sVar7 = (val->region_).first_line_;
  sVar8 = (val->region_).first_column_;
  sVar9 = (val->region_).last_line_;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xc0) = (val->region_).last_;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 200) = sVar9;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xb0) = sVar7;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xb8) = sVar8;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xa0) = sVar5;
  *(size_t *)
   ((long)iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur + 0xa8) = sVar6;
  _Var21._M_cur =
       (__node_type *)
       std::
       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find(&current_table_ptr->_M_h,__k);
  if (_Var21._M_cur != (__node_type *)0x0) {
LAB_003beaed:
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value =
         (value_type)
         ((long)&((_Var21._M_cur)->
                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                 ._M_storage._M_storage + 0x20);
    goto LAB_003be4e7;
  }
  std::__throw_out_of_range("_Map_base::at");
  pbVar26 = (basic_value<toml::type_config> *)current_table_ptr;
LAB_003bf322:
  local_d38._0_8_ = (basic_value<toml::type_config> *)local_d28;
  std::__cxx11::string::_M_construct<char_const*>
            (local_d38,
             "toml::insert_value: failed to insert a table, table keys conflict to each other","");
  source_location::source_location(&local_820,&key_loc);
  local_d58._0_8_ = local_d58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"inserting this table","");
  source_location::source_location((source_location *)local_ef0,(region *)(p_Var25 + 0xe));
  pvVar20 = basic_value<toml::type_config>::at(pbVar26,(key_type *)unaff_RBP);
  source_location::source_location((source_location *)local_fb8,&pvVar20->region_);
  make_error_info<toml::source_location,char_const(&)[18],toml::source_location,char_const(&)[21]>
            (&local_a50,(toml *)local_d38,(string *)&local_820,(source_location *)local_d58,
             (string *)local_ef0,(source_location *)"having this value",(char (*) [18])local_fb8,
             (source_location *)"already defined here",&__return_storage_ptr__->is_ok_);
  err<toml::error_info>(&local_2f0,&local_a50);
  __return_storage_ptr__->is_ok_ = false;
  failure<toml::error_info>::failure
            ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_2f0);
  failure<toml::error_info>::~failure(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.suffix_._M_dataplus._M_p != &local_a50.suffix_.field_2) {
    operator_delete(local_a50.suffix_._M_dataplus._M_p,
                    local_a50.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_a50.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.title_._M_dataplus._M_p != &local_a50.title_.field_2) {
    operator_delete(local_a50.title_._M_dataplus._M_p,
                    local_a50.title_.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)local_fb8);
  source_location::~source_location((source_location *)local_ef0);
  if ((undefined1 *)local_d58._0_8_ != local_d58 + 0x10) {
    operator_delete((void *)local_d58._0_8_,local_d58._16_8_ + 1);
  }
  source_location::~source_location(&local_820);
  local_ce8._0_8_ = local_d28._0_8_;
  pbVar15 = (basic_value<toml::type_config> *)local_d38._0_8_;
  if ((basic_value<toml::type_config> *)local_d38._0_8_ ==
      (basic_value<toml::type_config> *)local_d28) goto LAB_003be4e7;
  goto LAB_003be4df;
  while (pcVar16 = pcVar16 + 200, pcVar16 != pcVar2) {
LAB_003be75a:
    if (*pcVar16 != '\n') goto LAB_003be7b5;
  }
  paVar17 = basic_value<toml::type_config>::as_array_fmt(pbVar26);
  if (paVar17->fmt == array_of_tables) {
    this = (vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
            *)basic_value<toml::type_config>::as_array(pbVar26);
    std::
    vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
    ::emplace_back<toml::basic_value<toml::type_config>>(this,val);
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&current_table_ptr->_M_h,__k);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
        ._M_cur == (__node_type *)0x0) {
LAB_003bf688:
      uVar22 = std::__throw_out_of_range("_Map_base::at");
      source_location::~source_location((source_location *)local_ef0);
      if ((table_type *)local_dd8._0_8_ != current_table_ptr) {
        operator_delete((void *)local_dd8._0_8_,local_dd8._16_8_ + 1);
      }
      source_location::~source_location(&local_910);
      if (local_db8[0] != pbVar26) {
        operator_delete(local_db8[0],(ulong)((long)&(local_da8[0]->_M_dataplus)._M_p + 1));
      }
      source_location::~source_location(&key_loc);
      _Unwind_Resume(uVar22);
    }
    paVar18 = basic_value<toml::type_config>::as_array
                        ((basic_value<toml::type_config> *)
                         ((long)iVar13.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                ._M_cur + 0x28));
LAB_003bf272:
    pbVar4 = (paVar18->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = pbVar4 + -1;
    goto LAB_003be4e7;
  }
  local_db8[0] = (basic_value<toml::type_config> *)local_da8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_db8,
             "toml::insert_value: failed to insert a table, inline array of tables is immutable","")
  ;
  source_location::source_location(&local_910,&key_loc);
  local_dd8._0_8_ = (basic_value<toml::type_config> *)(local_dd8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dd8,"while inserting this","");
  source_location::source_location
            ((source_location *)local_ef0,
             (region *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                    ._M_cur + 0x70));
  make_error_info<toml::source_location,char_const(&)[31]>
            ((error_info *)local_fb8,(toml *)local_db8,(string *)&local_910,
             (source_location *)local_dd8,(string *)local_ef0,
             (source_location *)"this is inline array-of-tables",&__return_storage_ptr__->is_ok_);
  err<toml::error_info>(&local_3a0,(error_info *)local_fb8);
  __return_storage_ptr__->is_ok_ = false;
  failure<toml::error_info>::failure
            ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_3a0);
  failure<toml::error_info>::~failure(&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f80 != local_f70) {
    operator_delete((void *)local_f80,local_f70[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_f98);
  if ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10) {
    operator_delete((void *)local_fb8._0_8_,local_fb8._16_8_ + 1);
  }
  source_location::~source_location((source_location *)local_ef0);
  if ((basic_value<toml::type_config> *)local_dd8._0_8_ !=
      (basic_value<toml::type_config> *)(local_dd8 + 0x10)) {
    operator_delete((void *)local_dd8._0_8_,local_dd8._16_8_ + 1);
  }
  source_location::~source_location(&local_910);
  local_ce8._0_8_ = local_da8[0];
  pbVar15 = local_db8[0];
  if (local_db8[0] == (basic_value<toml::type_config> *)local_da8) goto LAB_003be4e7;
LAB_003be4df:
  operator_delete(pbVar15,(ulong)((long)&(((pointer)local_ce8._0_8_)->_M_dataplus)._M_p + 1));
LAB_003be4e7:
  source_location::~source_location(&key_loc);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>*, error_info>
insert_value(const inserting_value_kind kind,
    typename basic_value<TC>::table_type* current_table_ptr,
    const std::vector<typename basic_value<TC>::key_type>& keys, region key_reg,
    basic_value<TC> val)
{
    using value_type = basic_value<TC>;
    using array_type = typename basic_value<TC>::array_type;
    using table_type = typename basic_value<TC>::table_type;

    auto key_loc = source_location(key_reg);

    assert( ! keys.empty());

    // dotted key can insert to dotted key tables defined at the same level.
    // dotted key can NOT reopen a table even if it is implcitly-defined one.
    //
    // [x.y.z] # define x and x.y implicitly.
    // a = 42
    //
    // [x] # reopening implcitly defined table
    // r.s.t = 3.14 # VALID r and r.s are new tables.
    // r.s.u = 2.71 # VALID r and r.s are dotted-key tables. valid.
    //
    // y.z.b = "foo" # INVALID x.y.z are multiline table, not a dotted key.
    // y.c   = "bar" # INVALID x.y is implicit multiline table, not a dotted key.

    // a table cannot reopen dotted-key tables.
    //
    // [t1]
    // t2.t3.v = 0
    // [t1.t2] # INVALID t1.t2 is defined as a dotted-key table.

    for(std::size_t i=0; i<keys.size(); ++i)
    {
        const auto& key = keys.at(i);
        table_type& current_table = *current_table_ptr;

        if(i+1 < keys.size()) // there are more keys. go down recursively...
        {
            const auto found = current_table.find(key);
            if(found == current_table.end()) // not found. add new table
            {
                table_format_info fmt;
                fmt.indent_type = indent_char::none;
                if(kind == inserting_value_kind::dotted_keys)
                {
                    fmt.fmt = table_format::dotted;
                }
                else // table / array of tables
                {
                    fmt.fmt = table_format::implicit;
                }
                current_table.emplace(key, value_type(
                    table_type{}, fmt, std::vector<std::string>{}, key_reg));

                assert(current_table.at(key).is_table());
                current_table_ptr = std::addressof(current_table.at(key).as_table());
            }
            else if (found->second.is_table())
            {
                const auto fmt = found->second.as_table_fmt().fmt;
                if(fmt == table_format::oneline || fmt == table_format::multiline_oneline)
                {
                    // foo = {bar = "baz"} or foo = { \n bar = "baz" \n }
                    return err(make_error_info("toml::insert_value: "
                        "failed to insert a value: inline table is immutable",
                        key_loc, "inserting this",
                        found->second.location(), "to this table"));
                }
                // dotted key cannot reopen a table.
                if(kind ==inserting_value_kind::dotted_keys && fmt != table_format::dotted)
                {
                    return err(make_error_info("toml::insert_value: "
                        "reopening a table using dotted keys",
                        key_loc, "dotted key cannot reopen a table",
                        found->second.location(), "this table is already closed"));
                }
                assert(found->second.is_table());
                current_table_ptr = std::addressof(found->second.as_table());
            }
            else if(found->second.is_array_of_tables())
            {
                // aot = [{this = "type", of = "aot"}] # cannot be reopened
                if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                {
                    return err(make_error_info("toml::insert_value:"
                        "inline array of tables are immutable",
                        key_loc, "inserting this",
                        found->second.location(), "inline array of tables"));
                }
                // appending to [[aot]]

                if(kind == inserting_value_kind::dotted_keys)
                {
                    // [[array.of.tables]]
                    // [array.of]          # reopening supertable is okay
                    // tables.x = "foo"    # appending `x` to the first table
                    return err(make_error_info("toml::insert_value:"
                        "dotted key cannot reopen an array-of-tables",
                        key_loc, "inserting this",
                        found->second.location(), "to this array-of-tables."));
                }

                // insert_value_by_dotkeys::std_table
                // [[array.of.tables]]
                // [array.of.tables.subtable] # appending to the last aot
                //
                // insert_value_by_dotkeys::array_table
                // [[array.of.tables]]
                // [[array.of.tables.subtable]] # appending to the last aot
                auto& current_array_table = found->second.as_array().back();

                assert(current_array_table.is_table());
                current_table_ptr = std::addressof(current_array_table.as_table());
            }
            else
            {
                return err(make_error_info("toml::insert_value: "
                    "failed to insert a value, value already exists",
                    key_loc, "while inserting this",
                    found->second.location(), "non-table value already exists"));
            }
        }
        else // this is the last key. insert a new value.
        {
            switch(kind)
            {
                case inserting_value_kind::dotted_keys:
                {
                    if(current_table.find(key) != current_table.end())
                    {
                        return err(make_error_info("toml::insert_value: "
                            "failed to insert a value, value already exists",
                            key_loc, "inserting this",
                            current_table.at(key).location(), "but value already exists"));
                    }
                    current_table.emplace(key, std::move(val));
                    return ok(std::addressof(current_table.at(key)));
                }
                case inserting_value_kind::std_table:
                {
                    // defining a new table or reopening supertable
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        current_table.emplace(key, std::move(val));
                        return ok(std::addressof(current_table.at(key)));
                    }
                    else // the table is already defined, reopen it
                    {
                        // assigning a [std.table]. it must be an implicit table.
                        auto& target = found->second;
                        if( ! target.is_table() || // could be an array-of-tables
                            target.as_table_fmt().fmt != table_format::implicit)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, table already defined",
                                key_loc, "inserting this",
                                target.location(), "this table is explicitly defined"));
                        }

                        // merge table
                        for(const auto& kv : val.as_table())
                        {
                            if(target.contains(kv.first))
                            {
                                // [x.y.z]
                                // w = "foo"
                                // [x]
                                // y = "bar"
                                return err(make_error_info("toml::insert_value: "
                                    "failed to insert a table, table keys conflict to each other",
                                    key_loc, "inserting this table",
                                    kv.second.location(), "having this value",
                                    target.at(kv.first).location(), "already defined here"));
                            }
                            else
                            {
                                target[kv.first] = kv.second;
                            }
                        }
                        // change implicit -> explicit
                        target.as_table_fmt().fmt = table_format::multiline;
                        // change definition region
                        change_region_of_value(target, val);

                        return ok(std::addressof(current_table.at(key)));
                    }
                }
                case inserting_value_kind::array_table:
                {
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        array_format_info fmt;
                        fmt.fmt = array_format::array_of_tables;
                        fmt.indent_type = indent_char::none;

                        current_table.emplace(key, value_type(
                                array_type{ std::move(val) }, std::move(fmt),
                                std::vector<std::string>{}, std::move(key_reg)
                            ));

                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                    else // the array is already defined, append to it
                    {
                        if( ! found->second.is_array_of_tables())
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert an array of tables, value already exists",
                                key_loc, "while inserting this",
                                found->second.location(), "non-table value already exists"));
                        }
                        if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, inline array of tables is immutable",
                                key_loc, "while inserting this",
                                found->second.location(), "this is inline array-of-tables"));
                        }
                        found->second.as_array().push_back(std::move(val));
                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                }
                default: {assert(false);}
            }
        }
    }
    return err(make_error_info("toml::insert_key: no keys found",
                std::move(key_loc), "here"));
}